

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_api_legacy.cpp
# Opt level: O1

int __thiscall VpuApiLegacy::init(VpuApiLegacy *this,EVP_PKEY_CTX *ctx)

{
  MppBufferGroup *ppvVar1;
  MppPacket *ppvVar2;
  int iVar3;
  MppCodingType coding;
  uint uVar4;
  VpuApiMlvecStaticCfg *cfg;
  MppParam pvVar5;
  bool bVar6;
  RK_S32 RVar7;
  RK_S32 RVar8;
  RK_S32 RVar9;
  RK_S32 RVar10;
  RK_S32 RVar11;
  RK_S32 RVar12;
  RK_S32 RVar13;
  RK_S32 RVar14;
  RK_S32 RVar15;
  RK_S32 RVar16;
  RK_S32 RVar17;
  RK_S32 RVar18;
  undefined4 uVar19;
  MPP_RET MVar20;
  RK_U32 RVar21;
  MppFrameFormat MVar22;
  undefined4 uVar23;
  void *pvVar24;
  long in_RDX;
  char *pcVar25;
  uint uVar26;
  undefined8 uVar27;
  MppEncSeiMode sei_mode;
  RK_U32 flag;
  undefined4 local_4c;
  MppPacket local_48;
  MppCtx local_40;
  MppApi *local_38;
  
  if (((byte)vpu_api_debug & 1) != 0) {
    _mpp_log_l(4,"vpu_api_legacy","enter\n","init");
  }
  if ((this->mpp_ctx == (MppCtx)0x0) || (this->mpi == (MppApi *)0x0)) {
    _mpp_log_l(2,"vpu_api_legacy","found invalid context input",0);
    MVar20 = MPP_ERR_NULL_PTR;
  }
  else {
    iVar3 = *(int *)(ctx + 8);
    uVar27 = 0;
    if ((iVar3 == 1) || (uVar27 = 1, iVar3 == 2)) {
      MVar20 = mpp_init(this->mpp_ctx,uVar27,*(undefined4 *)(ctx + 0xc));
      if (MVar20 == MPP_OK) {
        if (iVar3 == 1) {
          (this->vpug).CodecType = *(RK_U32 *)(ctx + 8);
          (this->vpug).ImgWidth = *(RK_U32 *)(ctx + 0x10);
          (this->vpug).ImgHeight = *(RK_U32 *)(ctx + 0x14);
          if (*(uint **)(ctx + 0x88) == (uint *)0x0) {
            uVar26 = 0;
          }
          else {
            uVar26 = **(uint **)(ctx + 0x88);
          }
          local_40 = this->mpp_ctx;
          local_38 = this->mpi;
          pvVar5 = this->frm_info;
          if (*(int *)(ctx + 0x40) == 10) {
            RVar21 = (uint)(*(int *)(ctx + 0x44) == 1) * 2 + 1;
          }
          else if ((*(int *)(ctx + 0x40) == 0) && (*(int *)(ctx + 0x44) == 0)) {
            uVar4 = (this->vpug).ImgWidth;
            if ((int)uVar4 < 0) {
              RVar21 = (uVar4 >> 0x1d & 2) + 1;
            }
            else {
              RVar21 = (uint)(0x3fffffff < uVar4) * 2;
            }
          }
          else {
            RVar21 = (uint)(*(int *)(ctx + 0x44) == 1) * 2;
          }
          (this->vpug).CodecType = RVar21;
          (this->vpug).ImgWidth = (uint)(ushort)(this->vpug).ImgWidth;
          mpp_frame_set_width(pvVar5);
          mpp_frame_set_height(pvVar5,(this->vpug).ImgHeight);
          mpp_frame_set_fmt(pvVar5,uVar26 | (this->vpug).CodecType);
          (*local_38->control)(local_40,MPP_DEC_SET_FRAME_INFO,pvVar5);
          RVar21 = mpp_frame_get_hor_stride(pvVar5);
          (this->vpug).ImgHorStride = RVar21;
          RVar21 = mpp_frame_get_ver_stride(pvVar5);
          (this->vpug).ImgVerStride = RVar21;
          RVar21 = mpp_frame_get_buf_size(pvVar5);
          (this->vpug).BufSize = RVar21;
          if (in_RDX != 0) {
            local_48 = (MppPacket)0x0;
            mpp_packet_init(&local_48);
            mpp_packet_set_extra_data(local_48);
            (*this->mpi->decode_put_packet)(this->mpp_ctx,local_48);
            mpp_packet_deinit(&local_48);
          }
          local_48 = (MppPacket)((ulong)local_48 & 0xffffffff00000000);
          MVar20 = (*this->mpi->control)(this->mpp_ctx,MPP_DEC_SET_ENABLE_DEINTERLACE,&local_48);
          if (MVar20 != MPP_OK) {
            _mpp_log_l(2,"vpu_api_legacy","disable mpp deinterlace failed ret %d\n","init",MVar20);
          }
        }
        else {
          cfg = *(VpuApiMlvecStaticCfg **)(ctx + 0x88);
          coding = *(MppCodingType *)(ctx + 0xc);
          local_48 = (MppPacket)CONCAT44(local_48._4_4_,100);
          local_4c = 0;
          MVar20 = (*this->mpi->control)(this->mpp_ctx,MPP_SET_INPUT_TIMEOUT,&local_48);
          if (MVar20 != MPP_OK) {
            _mpp_log_l(2,"vpu_api_legacy","mpi control MPP_SET_INPUT_TIMEOUT failed\n",0);
          }
          MVar20 = (*this->mpi->control)(this->mpp_ctx,MPP_ENC_SET_SEI_CFG,&local_4c);
          if (MVar20 != MPP_OK) {
            _mpp_log_l(2,"vpu_api_legacy","mpi control MPP_ENC_SET_SEI_CFG failed ret %d\n",0,MVar20
                      );
          }
          ppvVar1 = &this->memGroup;
          if ((this->memGroup == (MppBufferGroup)0x0) &&
             (MVar20 = mpp_buffer_group_get(ppvVar1,1,0,"vpu_api_legacy","init"), MVar20 != MPP_OK))
          {
            bVar6 = false;
            _mpp_log_l(2,"vpu_api_legacy","memGroup mpp_buffer_group_get failed %d\n",0,MVar20);
          }
          else {
            MVar20 = mpp_enc_cfg_init(&this->enc_cfg);
            if (MVar20 == MPP_OK) {
              MVar22 = vpu_pic_type_remap_to_mpp(cfg->format);
              this->format = MVar22;
              uVar27._0_2_ = cfg->width;
              uVar27._2_2_ = cfg->sar_width;
              uVar27._4_2_ = cfg->height;
              uVar27._6_2_ = cfg->sar_height;
              RVar7 = cfg->rc_mode;
              RVar8 = cfg->bitRate;
              RVar9 = cfg->framerate;
              RVar10 = cfg->qp;
              RVar11 = cfg->enableCabac;
              RVar12 = cfg->cabacInitIdc;
              RVar13 = cfg->format;
              RVar14 = cfg->intraPicRate;
              RVar15 = cfg->framerateout;
              RVar16 = cfg->profileIdc;
              RVar17 = cfg->levelIdc;
              RVar18 = cfg->magic;
              uVar23 = *(undefined4 *)&cfg->field_0x38;
              uVar19 = *(undefined4 *)&cfg->field_0x3c;
              (this->enc_param).width = (int)uVar27;
              (this->enc_param).height = (int)((ulong)uVar27 >> 0x20);
              (this->enc_param).rc_mode = RVar7;
              (this->enc_param).bitRate = RVar8;
              (this->enc_param).framerate = RVar9;
              (this->enc_param).qp = RVar10;
              (this->enc_param).enableCabac = RVar11;
              (this->enc_param).cabacInitIdc = RVar12;
              (this->enc_param).format = RVar13;
              (this->enc_param).intraPicRate = RVar14;
              (this->enc_param).framerateout = RVar15;
              (this->enc_param).profileIdc = RVar16;
              (this->enc_param).levelIdc = RVar17;
              (this->enc_param).reserved[0] = RVar18;
              (this->enc_param).reserved[1] = uVar23;
              (this->enc_param).reserved[2] = uVar19;
              MVar20 = vpu_api_mlvec_check_cfg(cfg);
              if ((MVar20 == MPP_OK) && (this->mlvec == (VpuApiMlvec)0x0)) {
                vpu_api_mlvec_init(&this->mlvec);
                vpu_api_mlvec_setup(this->mlvec,this->mpp_ctx,this->mpi,this->enc_cfg);
              }
              if (this->mlvec != (VpuApiMlvec)0x0) {
                vpu_api_mlvec_set_st_cfg(this->mlvec,cfg);
              }
              vpu_api_set_enc_cfg(this->mpp_ctx,this->mpi,this->enc_cfg,coding,this->format,
                                  (EncParameter_t *)cfg);
              MVar20 = MPP_OK;
              bVar6 = true;
              if (this->mlvec == (VpuApiMlvec)0x0) {
                ppvVar2 = &this->enc_hdr_pkt;
                if (this->enc_hdr_pkt == (MppPacket)0x0) {
                  if (this->enc_hdr_buf == (void *)0x0) {
                    this->enc_hdr_buf_size = 0x400;
                    pvVar24 = (void *)mpp_osal_calloc("init",0x400);
                    this->enc_hdr_buf = pvVar24;
                  }
                  if (this->enc_hdr_buf != (void *)0x0) {
                    mpp_packet_init(ppvVar2,this->enc_hdr_buf,(long)this->enc_hdr_buf_size);
                  }
                }
                if ((*ppvVar2 == (MppPacket)0x0) &&
                   (_mpp_log_l(2,"vpu_api_legacy","Assertion %s failed at %s:%d\n",0,"enc_hdr_pkt",
                               "init",0x1e0), (DAT_0011234b & 0x10) != 0)) {
                  abort();
                }
                if (*ppvVar2 != (MppParam)0x0) {
                  MVar20 = (*this->mpi->control)(this->mpp_ctx,MPP_ENC_GET_HDR_SYNC,*ppvVar2);
                  uVar23 = mpp_packet_get_length(this->enc_hdr_pkt);
                  *(undefined4 *)(ctx + 0x20) = uVar23;
                  uVar27 = mpp_packet_get_data(this->enc_hdr_pkt);
                  *(undefined8 *)(ctx + 0x18) = uVar27;
                }
              }
            }
            else {
              bVar6 = false;
              _mpp_log_l(2,"vpu_api_legacy","mpp_enc_cfg_init failed %d\n",0,MVar20);
              mpp_buffer_group_put(*ppvVar1);
              *ppvVar1 = (MppBufferGroup)0x0;
            }
          }
          if (!bVar6) {
            return MVar20;
          }
        }
        this->init_ok = 1;
        if (((byte)vpu_api_debug & 1) == 0) {
          return MVar20;
        }
        pcVar25 = "leave\n";
        uVar27 = 4;
      }
      else {
        pcVar25 = " init error. \n";
        uVar27 = 2;
      }
      _mpp_log_l(uVar27,"vpu_api_legacy",pcVar25,"init");
    }
    else {
      _mpp_log_l(2,"vpu_api_legacy","found invalid codec type %d\n",0,iVar3);
      MVar20 = MPP_ERR_VPU_CODEC_INIT;
    }
  }
  return MVar20;
}

Assistant:

RK_S32 VpuApiLegacy::init(VpuCodecContext *ctx, RK_U8 *extraData, RK_U32 extra_size)
{
    vpu_api_dbg_func("enter\n");

    MPP_RET ret = MPP_OK;
    MppCtxType type;

    if (mpp_ctx == NULL || mpi == NULL) {
        mpp_err("found invalid context input");
        return MPP_ERR_NULL_PTR;
    }

    if (CODEC_DECODER == ctx->codecType) {
        type = MPP_CTX_DEC;
    } else if (CODEC_ENCODER == ctx->codecType) {
        type = MPP_CTX_ENC;
    } else {
        mpp_err("found invalid codec type %d\n", ctx->codecType);
        return MPP_ERR_VPU_CODEC_INIT;
    }

    ret = mpp_init(mpp_ctx, type, (MppCodingType)ctx->videoCoding);
    if (ret) {
        mpp_err_f(" init error. \n");
        return ret;
    }

    if (MPP_CTX_ENC == type) {
        EncParameter_t *param = (EncParameter_t*)ctx->private_data;
        MppCodingType coding = (MppCodingType)ctx->videoCoding;
        MppPollType block = (MppPollType)VPU_API_ENC_INPUT_TIMEOUT;
        MppEncSeiMode sei_mode = MPP_ENC_SEI_MODE_DISABLE;

        /* setup input / output block mode */
        ret = mpi->control(mpp_ctx, MPP_SET_INPUT_TIMEOUT, (MppParam)&block);
        if (MPP_OK != ret)
            mpp_err("mpi control MPP_SET_INPUT_TIMEOUT failed\n");

        /* disable sei by default */
        ret = mpi->control(mpp_ctx, MPP_ENC_SET_SEI_CFG, &sei_mode);
        if (ret)
            mpp_err("mpi control MPP_ENC_SET_SEI_CFG failed ret %d\n", ret);

        if (memGroup == NULL) {
            ret = mpp_buffer_group_get_internal(&memGroup, MPP_BUFFER_TYPE_ION);
            if (ret) {
                mpp_err("memGroup mpp_buffer_group_get failed %d\n", ret);
                return ret;
            }
        }

        ret = mpp_enc_cfg_init(&enc_cfg);
        if (ret) {
            mpp_err("mpp_enc_cfg_init failed %d\n", ret);
            mpp_buffer_group_put(memGroup);
            memGroup = NULL;
            return ret;
        }

        format = vpu_pic_type_remap_to_mpp((EncInputPictureType)param->format);

        memcpy(&enc_param, param, sizeof(enc_param));

        if (MPP_OK == vpu_api_mlvec_check_cfg(param)) {
            if (NULL == mlvec) {
                vpu_api_mlvec_init(&mlvec);
                vpu_api_mlvec_setup(mlvec, mpp_ctx, mpi, enc_cfg);
            }
        }

        if (mlvec)
            vpu_api_mlvec_set_st_cfg(mlvec, (VpuApiMlvecStaticCfg *)param);

        vpu_api_set_enc_cfg(mpp_ctx, mpi, enc_cfg, coding, format, param);

        if (!mlvec) {
            if (NULL == enc_hdr_pkt) {
                if (NULL == enc_hdr_buf) {
                    enc_hdr_buf_size = SZ_1K;
                    enc_hdr_buf = mpp_calloc_size(RK_U8, enc_hdr_buf_size);
                }

                if (enc_hdr_buf)
                    mpp_packet_init(&enc_hdr_pkt, enc_hdr_buf, enc_hdr_buf_size);
            }

            mpp_assert(enc_hdr_pkt);
            if (enc_hdr_pkt) {
                ret = mpi->control(mpp_ctx, MPP_ENC_GET_HDR_SYNC, enc_hdr_pkt);
                ctx->extradata_size = mpp_packet_get_length(enc_hdr_pkt);
                ctx->extradata      = mpp_packet_get_data(enc_hdr_pkt);
            }
        }
    } else { /* MPP_CTX_DEC */
        vpug.CodecType  = ctx->codecType;
        vpug.ImgWidth   = ctx->width;
        vpug.ImgHeight  = ctx->height;

        init_frame_info(ctx, mpp_ctx, mpi, frm_info, &vpug);

        if (extraData != NULL) {
            MppPacket pkt = NULL;

            mpp_packet_init(&pkt, extraData, extra_size);
            mpp_packet_set_extra_data(pkt);
            mpi->decode_put_packet(mpp_ctx, pkt);
            mpp_packet_deinit(&pkt);
        }

        RK_U32 flag = 0;
        ret = mpi->control(mpp_ctx, MPP_DEC_SET_ENABLE_DEINTERLACE, &flag);
        if (ret)
            mpp_err_f("disable mpp deinterlace failed ret %d\n", ret);
    }

    init_ok = 1;

    vpu_api_dbg_func("leave\n");
    return ret;
}